

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TuningsImpl.h
# Opt level: O2

istream * Tunings::getlineEndingIndependent(istream *is,string *t)

{
  int iVar1;
  sentry se;
  
  t->_M_string_length = 0;
  *(t->_M_dataplus)._M_p = '\0';
  std::istream::sentry::sentry((sentry *)&se,is,true);
  if (se == (sentry)0x1) {
    while (iVar1 = std::streambuf::sbumpc(), iVar1 != -1) {
      if (iVar1 == 10) {
        return is;
      }
      if (iVar1 == 0xd) {
        iVar1 = std::streambuf::sgetc();
        if (iVar1 != 10) {
          return is;
        }
        std::streambuf::sbumpc();
        return is;
      }
      std::__cxx11::string::push_back((char)t);
    }
    std::ios::setstate((int)*(undefined8 *)(*(long *)is + -0x18) + (int)is);
    if (t->_M_string_length == 0) {
      std::ios::setstate((int)*(undefined8 *)(*(long *)is + -0x18) + (int)is);
    }
  }
  return is;
}

Assistant:

inline std::istream &getlineEndingIndependent(std::istream &is, std::string &t)
{
    t.clear();

    std::istream::sentry se(is, true);
    if (!se)
        return is;

    std::streambuf *sb = is.rdbuf();

    for (;;)
    {
        int c = sb->sbumpc();
        switch (c)
        {
        case '\n':
            return is;
        case '\r':
            if (sb->sgetc() == '\n')
            {
                sb->sbumpc();
            }
            return is;
        case EOF:
            is.setstate(std::ios::eofbit);
            if (t.empty())
            {
                is.setstate(std::ios::badbit);
            }
            return is;
        default:
            t += (char)c;
        }
    }
}